

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::
verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation(GPUShaderFP64Test1 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  char *local_340;
  MessageBuilder local_338;
  int local_1b8;
  GLenum error_code;
  _uniform_function local_1a4;
  _uniform_function local_1a0;
  _uniform_function uniform_function;
  uint n_uniform_function;
  GLint invalid_uniform_location;
  double double_data [16];
  GLint uniform_location;
  uint n_uniform_location;
  GLint valid_uniform_location;
  uint n_uniform_locations;
  GLint uniform_locations [58];
  bool result;
  Functions *gl;
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uniform_locations[0x39]._3_1_ = 1;
  valid_uniform_location = this->m_po_bool_arr_uniform_location;
  n_uniform_locations = this->m_po_bool_uniform_location;
  uniform_locations[0] = this->m_po_bvec2_arr_uniform_location;
  uniform_locations[1] = this->m_po_bvec2_uniform_location;
  uniform_locations[2] = this->m_po_bvec3_arr_uniform_location;
  uniform_locations[3] = this->m_po_bvec3_uniform_location;
  uniform_locations[4] = this->m_po_bvec4_arr_uniform_location;
  uniform_locations[5] = this->m_po_bvec4_uniform_location;
  uniform_locations[6] = this->m_po_dmat2_arr_uniform_location;
  uniform_locations[7] = this->m_po_dmat2_uniform_location;
  uniform_locations[8] = this->m_po_dmat2x3_arr_uniform_location;
  uniform_locations[9] = this->m_po_dmat2x3_uniform_location;
  uniform_locations[10] = this->m_po_dmat2x4_arr_uniform_location;
  uniform_locations[0xb] = this->m_po_dmat2x4_uniform_location;
  uniform_locations[0xc] = this->m_po_dmat3_arr_uniform_location;
  uniform_locations[0xd] = this->m_po_dmat3_uniform_location;
  uniform_locations[0xe] = this->m_po_dmat3x2_arr_uniform_location;
  uniform_locations[0xf] = this->m_po_dmat3x2_uniform_location;
  uniform_locations[0x10] = this->m_po_dmat3x4_arr_uniform_location;
  uniform_locations[0x11] = this->m_po_dmat3x4_uniform_location;
  uniform_locations[0x12] = this->m_po_dmat4_arr_uniform_location;
  uniform_locations[0x13] = this->m_po_dmat4_uniform_location;
  uniform_locations[0x14] = this->m_po_dmat4x2_arr_uniform_location;
  uniform_locations[0x15] = this->m_po_dmat4x2_uniform_location;
  uniform_locations[0x16] = this->m_po_dmat4x3_arr_uniform_location;
  uniform_locations[0x17] = this->m_po_dmat4x3_uniform_location;
  uniform_locations[0x18] = this->m_po_double_arr_uniform_location;
  uniform_locations[0x19] = this->m_po_double_uniform_location;
  uniform_locations[0x1a] = this->m_po_dvec2_arr_uniform_location;
  uniform_locations[0x1b] = this->m_po_dvec2_uniform_location;
  uniform_locations[0x1c] = this->m_po_dvec3_arr_uniform_location;
  uniform_locations[0x1d] = this->m_po_dvec3_uniform_location;
  uniform_locations[0x1e] = this->m_po_dvec4_arr_uniform_location;
  uniform_locations[0x1f] = this->m_po_dvec4_uniform_location;
  uniform_locations[0x20] = this->m_po_float_arr_uniform_location;
  uniform_locations[0x21] = this->m_po_float_uniform_location;
  uniform_locations[0x22] = this->m_po_int_arr_uniform_location;
  uniform_locations[0x23] = this->m_po_int_uniform_location;
  uniform_locations[0x24] = this->m_po_ivec2_arr_uniform_location;
  uniform_locations[0x25] = this->m_po_ivec2_uniform_location;
  uniform_locations[0x26] = this->m_po_ivec3_arr_uniform_location;
  uniform_locations[0x27] = this->m_po_ivec3_uniform_location;
  uniform_locations[0x28] = this->m_po_ivec4_arr_uniform_location;
  uniform_locations[0x29] = this->m_po_ivec4_uniform_location;
  uniform_locations[0x2a] = this->m_po_uint_arr_uniform_location;
  uniform_locations[0x2b] = this->m_po_uint_uniform_location;
  uniform_locations[0x2c] = this->m_po_uvec2_arr_uniform_location;
  uniform_locations[0x2d] = this->m_po_uvec2_uniform_location;
  uniform_locations[0x2e] = this->m_po_uvec3_arr_uniform_location;
  uniform_locations[0x2f] = this->m_po_uvec3_uniform_location;
  uniform_locations[0x30] = this->m_po_uvec4_arr_uniform_location;
  uniform_locations[0x31] = this->m_po_uvec4_uniform_location;
  uniform_locations[0x32] = this->m_po_vec2_arr_uniform_location;
  uniform_locations[0x33] = this->m_po_vec2_uniform_location;
  uniform_locations[0x34] = this->m_po_vec3_arr_uniform_location;
  uniform_locations[0x35] = this->m_po_vec3_uniform_location;
  uniform_locations[0x36] = this->m_po_vec4_arr_uniform_location;
  uniform_locations[0x37] = this->m_po_vec4_uniform_location;
  uniform_location = -1;
  for (double_data[0xf]._4_4_ = 0; double_data[0xf]._4_4_ < 0x3a;
      double_data[0xf]._4_4_ = double_data[0xf]._4_4_ + 1) {
    double_data[0xf]._0_4_ = (&valid_uniform_location)[double_data[0xf]._4_4_];
    if (uniform_location < double_data[0xf]._0_4_) {
      uniform_location = double_data[0xf]._0_4_;
    }
  }
  memcpy(&n_uniform_function,&DAT_029ee9a0,0x80);
  uniform_function = uniform_location + UNIFORM_FUNCTION_1DV;
  for (local_1a0 = UNIFORM_FUNCTION_1D; local_1a0 < UNIFORM_FUNCTION_COUNT;
      local_1a0 = local_1a0 + UNIFORM_FUNCTION_1DV) {
    local_1a4 = local_1a0;
    switch(local_1a0) {
    case UNIFORM_FUNCTION_1D:
      (**(code **)(lVar3 + 0x14d0))(0,uniform_function);
      break;
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(lVar3 + 0x14d8))(uniform_function,1,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_2D:
      (**(code **)(lVar3 + 0x1510))(0,0x3ff0000000000000,uniform_function);
      break;
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(lVar3 + 0x1518))(uniform_function,1,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_3D:
      (**(code **)(lVar3 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000,uniform_function);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(lVar3 + 0x1558))(uniform_function,1,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_4D:
      (**(code **)(lVar3 + 0x1590))
                (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,uniform_function);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(lVar3 + 0x1598))(uniform_function,1,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(lVar3 + 0x15d8))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(lVar3 + 0x15e8))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(lVar3 + 0x15f8))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(lVar3 + 0x1608))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(lVar3 + 0x1618))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(lVar3 + 0x1628))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(lVar3 + 0x1638))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(lVar3 + 0x1648))(uniform_function,1,0,&n_uniform_function);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(lVar3 + 0x1658))(uniform_function,1,0,&n_uniform_function);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xa7c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_1b8 = (**(code **)(lVar3 + 0x800))();
    if (local_1b8 != 0x502) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_338,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [10])"Function ");
      local_340 = getUniformFunctionString(this,local_1a4);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_340);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [88])
                                 "() did not generate an error when passed an invalid uniform location different from -1."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
      uniform_locations[0x39]._3_1_ = 0;
    }
  }
  return (bool)(uniform_locations[0x39]._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Find the largest valid uniform location */
	const glw::GLint uniform_locations[] = {
		m_po_bool_arr_uniform_location,	m_po_bool_uniform_location,		  m_po_bvec2_arr_uniform_location,
		m_po_bvec2_uniform_location,	   m_po_bvec3_arr_uniform_location,   m_po_bvec3_uniform_location,
		m_po_bvec4_arr_uniform_location,   m_po_bvec4_uniform_location,		  m_po_dmat2_arr_uniform_location,
		m_po_dmat2_uniform_location,	   m_po_dmat2x3_arr_uniform_location, m_po_dmat2x3_uniform_location,
		m_po_dmat2x4_arr_uniform_location, m_po_dmat2x4_uniform_location,	 m_po_dmat3_arr_uniform_location,
		m_po_dmat3_uniform_location,	   m_po_dmat3x2_arr_uniform_location, m_po_dmat3x2_uniform_location,
		m_po_dmat3x4_arr_uniform_location, m_po_dmat3x4_uniform_location,	 m_po_dmat4_arr_uniform_location,
		m_po_dmat4_uniform_location,	   m_po_dmat4x2_arr_uniform_location, m_po_dmat4x2_uniform_location,
		m_po_dmat4x3_arr_uniform_location, m_po_dmat4x3_uniform_location,	 m_po_double_arr_uniform_location,
		m_po_double_uniform_location,	  m_po_dvec2_arr_uniform_location,   m_po_dvec2_uniform_location,
		m_po_dvec3_arr_uniform_location,   m_po_dvec3_uniform_location,		  m_po_dvec4_arr_uniform_location,
		m_po_dvec4_uniform_location,	   m_po_float_arr_uniform_location,   m_po_float_uniform_location,
		m_po_int_arr_uniform_location,	 m_po_int_uniform_location,		  m_po_ivec2_arr_uniform_location,
		m_po_ivec2_uniform_location,	   m_po_ivec3_arr_uniform_location,   m_po_ivec3_uniform_location,
		m_po_ivec4_arr_uniform_location,   m_po_ivec4_uniform_location,		  m_po_uint_arr_uniform_location,
		m_po_uint_uniform_location,		   m_po_uvec2_arr_uniform_location,   m_po_uvec2_uniform_location,
		m_po_uvec3_arr_uniform_location,   m_po_uvec3_uniform_location,		  m_po_uvec4_arr_uniform_location,
		m_po_uvec4_uniform_location,	   m_po_vec2_arr_uniform_location,	m_po_vec2_uniform_location,
		m_po_vec3_arr_uniform_location,	m_po_vec3_uniform_location,		  m_po_vec4_arr_uniform_location,
		m_po_vec4_uniform_location
	};
	const unsigned int n_uniform_locations	= sizeof(uniform_locations) / sizeof(uniform_locations[0]);
	glw::GLint		   valid_uniform_location = -1;

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = uniform_locations[n_uniform_location];

		if (uniform_location > valid_uniform_location)
		{
			valid_uniform_location = uniform_location;
		}
	} /* for (all  uniform locations) */

	/* Iterate through all uniform functions and make sure GL_INVALID_OPERATION error is always generated
	 * for invalid uniform location that is != -1
	 */
	const double double_data[] = {
		1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0
	};
	const glw::GLint invalid_uniform_location = valid_uniform_location + 1;

	for (unsigned int n_uniform_function = UNIFORM_FUNCTION_FIRST; n_uniform_function < UNIFORM_FUNCTION_COUNT;
		 ++n_uniform_function)
	{
		_uniform_function uniform_function = (_uniform_function)n_uniform_function;

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(invalid_uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(invalid_uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(invalid_uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(invalid_uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;

		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(invalid_uniform_location, 1 /* count */, double_data);
			break;

		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		}

		const glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() did not generate an error"
								  " when passed an invalid uniform location different from -1."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}